

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void hashkey(connectdata *conn,char *buf,size_t len,char **hostp)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  
  uVar2 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
  if ((uVar2 & 9) == 1) {
    iVar1 = conn->port;
    ppcVar3 = &(conn->http_proxy).host.name;
  }
  else {
    iVar1 = conn->remote_port;
    if ((uVar2 >> 8 & 1) == 0) {
      ppcVar3 = &(conn->host).name;
    }
    else {
      ppcVar3 = &(conn->conn_to_host).name;
    }
  }
  if (len != 0) {
    *(char **)len = *ppcVar3;
  }
  curl_msnprintf(buf,0x80,"%ld%s",(long)iVar1);
  Curl_strntolower(buf,buf,0x80);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len,  /* something like 128 is fine */
                    const char **hostp)
{
  const char *hostname;
  long port = conn->remote_port;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->port;
  }
  else
#endif
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  if(hostp)
    /* report back which name we used */
    *hostp = hostname;

  /* put the number first so that the hostname gets cut off if too long */
  msnprintf(buf, len, "%ld%s", port, hostname);
  Curl_strntolower(buf, buf, len);
}